

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

void __thiscall
kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,InterfaceInstantiationStmt *stmt)

{
  undefined1 *puVar1;
  InterfaceRef *pIVar2;
  ostream *poVar3;
  string_view sVar4;
  string local_50;
  
  if ((stmt->super_Stmt).super_IRNode.comment._M_string_length != 0) {
    sVar4 = indent(this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&(this->stream_).super_stringstream.field_0x10,sVar4._M_str,
                        sVar4._M_len);
    poVar3 = std::operator<<(poVar3,"// ");
    strip_newline(&local_50,&(stmt->super_Stmt).super_IRNode.comment);
    poVar3 = std::operator<<(poVar3,(string *)&local_50);
    puVar1 = &(this->stream_).super_stringstream.field_0x90;
    *(long *)puVar1 = *(long *)puVar1 + 1;
    std::operator<<(poVar3,'\n');
    std::__cxx11::string::~string((string *)&local_50);
  }
  (stmt->super_Stmt).super_IRNode.verilog_ln =
       *(uint32_t *)&(this->stream_).super_stringstream.field_0x90;
  pIVar2 = stmt->interface_;
  sVar4 = indent(this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&(this->stream_).super_stringstream.field_0x10,sVar4._M_str,
                      sVar4._M_len);
  (*((pIVar2->definition_).super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->_vptr_IDefinition[7])(&local_50);
  poVar3 = std::operator<<(poVar3,(string *)&local_50);
  poVar3 = std::operator<<(poVar3," ");
  std::operator<<(poVar3,(string *)&pIVar2->name_);
  std::__cxx11::string::~string((string *)&local_50);
  generate_port_interface(this,&stmt->super_InstantiationStmt);
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(kratos::InterfaceInstantiationStmt* stmt) {
    // comment
    if (!stmt->comment.empty()) {
        stream_ << indent() << "// " << strip_newline(stmt->comment) << stream_.endl();
    }
    stmt->verilog_ln = stream_.line_no();
    auto const& interface = stmt->interface();
    stream_ << indent() << interface->definition()->def_name() << " " << interface->name();
    // TODO: allow parametrization
    generate_port_interface(stmt);
}